

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::SetFrameQpSVC3TL3SLTest(DatarateTestSVC *this)

{
  bool bVar1;
  ParamType *message;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  uint uVar3;
  long *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_sl2;
  int bitrate_sl1;
  int bitrate_sl0;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffef4;
  int line;
  allocator *file;
  undefined4 in_stack_ffffffffffffff18;
  Type in_stack_ffffffffffffff1c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  undefined8 local_a8 [2];
  Message *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  string local_88 [32];
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0x1a) = 500;
  *(undefined4 *)((long)in_RDI + 0xd4) = 500;
  *(undefined4 *)((long)in_RDI + 0xcc) = 1000;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0x3f;
  *(undefined4 *)(in_RDI + 0x12) = 1;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x315) = 1;
  *(undefined4 *)(in_RDI + 0x316) = 300;
  file = (allocator *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",file);
  uVar4 = 300;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_ffffffffffffff20,
             (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (uint)((ulong)file >> 0x20),(uint)file,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  local_a8[0] = 0x4b000000258;
  message = testing::
            WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
            ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7c81aa);
  *(undefined4 *)(in_RDI + 0x17) = *(undefined4 *)((long)local_a8 + (long)*p_Var2 * 4);
  (**(code **)(*in_RDI + 0x40))();
  *(undefined4 *)(in_RDI + 0x9e) = 3;
  *(undefined4 *)((long)in_RDI + 0x4f4) = 3;
  uVar3 = *(uint *)(in_RDI + 0x17) >> 3;
  *(int *)(in_RDI + 0x9f) = (int)(uVar3 * 0x32) / 100;
  *(int *)((long)in_RDI + 0x4fc) = (int)(uVar3 * 0x46) / 100;
  *(uint *)(in_RDI + 0xa0) = uVar3;
  uVar3 = (uint)((int)in_RDI[0x17] * 3) >> 3;
  *(int *)((long)in_RDI + 0x504) = (int)(uVar3 * 0x32) / 100;
  *(int *)(in_RDI + 0xa1) = (int)(uVar3 * 0x46) / 100;
  *(uint *)((long)in_RDI + 0x50c) = uVar3;
  uVar3 = *(uint *)(in_RDI + 0x17) >> 1 & 0x1fffffff;
  *(int *)(in_RDI + 0xa2) = (int)(uVar3 * 0x32) / 100;
  *(int *)((long)in_RDI + 0x514) = (int)(uVar3 * 0x46) / 100;
  *(uint *)(in_RDI + 0xa3) = uVar3;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff20)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(in_RDI[3] + 0x10))(in_RDI + 3,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff30);
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
    if ((!bVar1) || (!bVar1)) goto LAB_007c84d0;
  }
  line = (int)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)in_stack_ffffffffffffff20);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)file,line,
             (char *)message);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,uVar4));
  testing::Message::~Message((Message *)0x7c8484);
LAB_007c84d0:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7c84dd);
  return;
}

Assistant:

virtual void SetFrameQpSVC3TL3SLTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    user_define_frame_qp_ = 1;
    total_frame_ = 300;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }